

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRegistry.cpp
# Opt level: O0

UtestShell * __thiscall TestRegistry::findTestWithGroup(TestRegistry *this,SimpleString *group)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  long in_RDI;
  UtestShell *current;
  UtestShell *in_stack_ffffffffffffffb8;
  SimpleString *left;
  SimpleString local_28;
  UtestShell *local_20;
  
  local_20 = *(UtestShell **)(in_RDI + 8);
  while( true ) {
    if (local_20 == (UtestShell *)0x0) {
      return (UtestShell *)0x0;
    }
    left = &local_28;
    UtestShell::getGroup(in_stack_ffffffffffffffb8);
    bVar1 = operator==(left,(SimpleString *)in_stack_ffffffffffffffb8);
    SimpleString::~SimpleString((SimpleString *)0x21eb97);
    if (bVar1) break;
    iVar2 = (*local_20->_vptr_UtestShell[3])();
    local_20 = (UtestShell *)CONCAT44(extraout_var,iVar2);
  }
  return local_20;
}

Assistant:

UtestShell* TestRegistry::findTestWithGroup(const SimpleString& group)
{
    UtestShell* current = tests_;
    while (current) {
        if (current->getGroup() == group)
            return current;
        current = current->getNext();
    }
    return NULL;
}